

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                  *this,Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *container,
                 MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pbVar3;
  pointer pMVar4;
  MatchResultListener *pMVar5;
  NodeBase *pNVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  size_t count;
  size_t sVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  uVar8 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar9 = (ulong)uVar8;
  if (uVar8 != (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    pNVar6 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar9];
    if (pNVar6 == (NodeBase *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
    pMVar4 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar12 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_finish == pMVar4;
    bVar13 = !bVar12;
    if (bVar12) {
      sVar10 = 0;
    }
    else {
      sVar10 = 0;
      do {
        if (poVar1 == (ostream *)0x0) {
          local_1c8._8_8_ = (ostream *)0x0;
          local_1c8._0_8_ = &PTR__MatchResultListener_01870a48;
          bVar12 = MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                   ::MatchAndExplain(&pMVar4[sVar10].
                                      super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                                     ,(pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>
                                       *)(pNVar6 + 1),(MatchResultListener *)local_1c8);
        }
        else {
          local_1c8._8_8_ = local_1a8;
          local_1c8._0_8_ = &PTR__StringMatchResultListener_01870a90;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
          bVar12 = MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                   ::MatchAndExplain(&(this->matchers_).
                                      super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[sVar10].
                                      super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                                     ,(pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>
                                       *)(pNVar6 + 1),(MatchResultListener *)local_1c8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=
                    ((string *)
                     (local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar10),(string *)local_1e8);
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          local_1c8._0_8_ = &PTR__StringMatchResultListener_01870a90;
          std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
          std::ios_base::~ios_base(local_138);
        }
        if (!bVar12) break;
        pNVar6 = pNVar6->next;
        if (pNVar6 == (NodeBase *)0x0) {
          do {
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
            if ((container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <=
                uVar8) {
              count = sVar10 + 1;
              bVar13 = false;
              sVar10 = count;
              goto LAB_00848a52;
            }
            pNVar6 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar8];
          } while (pNVar6 == (NodeBase *)0x0);
        }
        sVar10 = sVar10 + 1;
        pMVar4 = (this->matchers_).
                 super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar13 = sVar10 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
                           -0x5555555555555555;
      } while (bVar13);
    }
    count = sVar10;
    do {
      count = count + 1;
      pNVar6 = pNVar6->next;
      while (pNVar6 == (NodeBase *)0x0) {
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
        if ((container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar8)
        goto LAB_00848a52;
        pNVar6 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar8];
      }
    } while( true );
  }
  bVar13 = false;
  count = 0;
  sVar10 = 0;
LAB_00848a52:
  pMVar4 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (count == ((long)pMVar2 - (long)pMVar4 >> 3) * -0x5555555555555555) {
    if (!bVar13) {
      bVar13 = true;
      if (pMVar2 != pMVar4 && poVar1 != (ostream *)0x0) {
        lVar7 = 8;
        bVar12 = false;
        lVar11 = 0;
        do {
          pbVar3 = local_200.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar7) != 0) {
            if (bVar12) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            bVar12 = true;
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)pbVar3 + lVar7 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7));
            }
          }
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + 0x20;
        } while (lVar11 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
      }
      goto LAB_00848b5f;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      poVar1 = listener->stream_;
      bVar13 = false;
      if ((poVar1 == (ostream *)0x0) ||
         (bVar13 = false,
         local_200.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_string_length == 0))
      goto LAB_00848b5f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_200.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_dataplus._M_p,
                 local_200.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_string_length);
    }
  }
  else if (count != 0 && poVar1 != (ostream *)0x0) {
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
              *)local_1c8,count);
    MatchResultListener::operator<<(pMVar5,(Message *)local_1c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1c8._0_8_ !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar13 = false;
LAB_00848b5f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar13;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }